

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_ui.cpp
# Opt level: O3

bool InitError(bilingual_str *str,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *details)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar1 = (details->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (details->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    pcVar3 = (str->original)._M_dataplus._M_p;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar3,pcVar3 + (str->original)._M_string_length);
    local_58._M_p = (pointer)&local_48;
    pcVar3 = (str->translated)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + (str->translated)._M_string_length);
  }
  else {
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"%s:\n%s","");
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,local_d8._M_p,local_d8._M_p + local_d0);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_d8._M_p,local_d8._M_p + local_d0);
    util::
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[2],util::MakeUnorderedList(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_>
              (local_f8,(util *)details,"\n");
    tinyformat::format<bilingual_str,std::__cxx11::string>
              ((bilingual_str *)local_78,(tinyformat *)local_b8,str,(bilingual_str *)local_f8,in_R8)
    ;
  }
  InitError((bilingual_str *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pbVar1 != pbVar2) {
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool InitError(const bilingual_str& str, const std::vector<std::string>& details)
{
    // For now just flatten the list of error details into a string to pass to
    // the base InitError overload. In the future, if more init code provides
    // error details, the details could be passed separately from the main
    // message for rich display in the GUI. But currently the only init
    // functions which provide error details are ones that run during early init
    // before the GUI uiInterface is registered, so there's no point passing
    // main messages and details separately to uiInterface yet.
    return InitError(details.empty() ? str : strprintf(Untranslated("%s:\n%s"), str, MakeUnorderedList(details)));
}